

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  void *__src;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  __src = malloc((long)(nRegs + 1));
  uVar2 = 0;
  uVar3 = (ulong)(uint)nRegs;
  if (nRegs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    *(undefined1 *)((long)__src + uVar2) = 0x2d;
  }
  *(undefined1 *)((long)__src + uVar3) = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)p->nLits;
  if (p->nLits < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar6 = *(int *)(&p->field_0x14 + uVar2 * 4);
    if (iVar6 != -1) {
      *(byte *)((long)__src + (long)(iVar6 >> 1)) = (byte)iVar6 & 1 ^ 0x31;
    }
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    for (lVar5 = 0; lVar4 = (long)iVar6, lVar5 < vFlopCounts->nSize; lVar5 = lVar5 + 1) {
      iVar1 = Vec_IntEntry(vFlopCounts,(int)lVar5);
      if (iVar1 != 0) {
        iVar6 = iVar6 + 1;
        *(undefined1 *)((long)__src + lVar4) = *(undefined1 *)((long)__src + lVar5);
      }
    }
    *(undefined1 *)((long)__src + lVar4) = 0;
  }
  iVar1 = vStr->nSize;
  if (vStr->nCap < iVar1 + iVar6) {
    Vec_StrGrow(vStr,(iVar1 + iVar6) * 2);
    iVar1 = vStr->nSize;
  }
  memcpy(vStr->pArray + iVar1,__src,(long)iVar6);
  vStr->nSize = vStr->nSize + iVar6;
  Vec_StrPush(vStr,' ');
  Vec_StrPush(vStr,'0');
  Vec_StrPush(vStr,'\n');
  free(__src);
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[lit_var(p->Lits[i])] = (lit_sign(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '0' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}